

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O1

int ini_find_section(ini_t *ini,char *name,int name_length)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  undefined8 in_RCX;
  ulong uVar4;
  ulong uVar5;
  ini_internal_section_t *__s2;
  ini_internal_section_t *piVar6;
  
  uVar4 = CONCAT71((int7)((ulong)in_RCX >> 8),name == (char *)0x0 || ini == (ini_t *)0x0);
  if (name != (char *)0x0 && ini != (ini_t *)0x0) {
    if (name_length < 1) {
      name_length = sx_strlen(name);
    }
    iVar1 = ini->section_count;
    if (0 < (long)iVar1) {
      piVar6 = ini->sections;
      uVar5 = 0;
      do {
        __s2 = (ini_internal_section_t *)piVar6->name_large;
        if ((ini_internal_section_t *)piVar6->name_large == (ini_internal_section_t *)0x0) {
          __s2 = piVar6;
        }
        iVar3 = strncasecmp(name,__s2->name,(long)name_length);
        uVar2 = uVar5;
        if (iVar3 != 0) {
          uVar2 = uVar4;
        }
        uVar4 = uVar2 & 0xffffffff;
        if (iVar3 == 0) {
          return (int)uVar2;
        }
        uVar5 = uVar5 + 1;
        piVar6 = piVar6 + 1;
      } while ((long)iVar1 != uVar5);
    }
  }
  return -1;
}

Assistant:

int ini_find_section( ini_t const* ini, char const* name, int name_length )
    {
    int i;

    if( ini && name )
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        for( i = 0; i < ini->section_count; ++i )
            {
            char const* const other = 
                ini->sections[ i ].name_large ? ini->sections[ i ].name_large : ini->sections[ i ].name;
            if( INI_STRNICMP( name, other, name_length ) == 0 )
                return i;
            }
        }

    return INI_NOT_FOUND;
    }